

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutils.c
# Opt level: O1

void exchange_int16s(void *a,void *b,size_t size)

{
  undefined2 uVar1;
  ulong uVar2;
  uint16_t *bp;
  uint16_t *ap;
  
  if (1 < size) {
    uVar2 = 0;
    do {
      uVar1 = *(undefined2 *)((long)a + uVar2 * 2);
      *(undefined2 *)((long)a + uVar2 * 2) = *(undefined2 *)((long)b + uVar2 * 2);
      *(undefined2 *)((long)b + uVar2 * 2) = uVar1;
      uVar2 = uVar2 + 1;
    } while (size >> 1 != uVar2);
  }
  return;
}

Assistant:

static void exchange_int16s(void *a, void *b, size_t size) {
    uint16_t *ap = (uint16_t *)a;
    uint16_t *bp = (uint16_t *)b;

    for (size /= sizeof(uint16_t); size-- != 0;) {
        uint16_t t = *ap;
        *ap++ = *bp;
        *bp++ = t;
    }
}